

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

void render_element(element_t *element,render_context_t *context,render_state_t *state)

{
  element_t **ppeVar1;
  plutovg_path_t *path;
  char *pcVar2;
  size_t sVar3;
  render_state **pprVar4;
  long lVar5;
  _Bool _Var6;
  bool bVar7;
  int iVar8;
  char *it_1;
  render_state *prVar9;
  element_t *element_00;
  attribute *paVar10;
  string_t *psVar11;
  byte *pbVar12;
  byte *pbVar13;
  char *pcVar14;
  char *pcVar15;
  plutovg_surface_t *surface;
  char *pcVar16;
  view_position_t *position;
  size_t sVar17;
  long lVar18;
  byte *end;
  element *peVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float x;
  length_t x_1;
  length_t y;
  length_t ry;
  char *it;
  length_t rx;
  render_state_t new_state;
  float local_d4;
  float local_c8;
  float local_c4;
  length_t local_c0;
  length_t local_b8;
  length_t local_b0;
  float local_a8;
  float local_a4;
  length_t local_a0;
  plutovg_matrix_t local_98;
  length_t local_80;
  render_state_t local_78;
  
  switch(element->id) {
  case 1:
    _Var6 = is_display_none(element);
    if (_Var6) {
      return;
    }
    _Var6 = is_visibility_hidden(element);
    if (_Var6) {
      return;
    }
    local_98.a = 0.0;
    local_98.b = 1.4013e-45;
    parse_length(element,0x17,(length_t *)&local_98,false,false);
    fVar22 = local_98.a;
    if ((local_98.a == 0.0) && (!NAN(local_98.a))) {
      return;
    }
    local_d4 = local_98.a;
    local_c0.value = 0.0;
    local_c0.type = length_type_fixed;
    local_b8.value = 0.0;
    local_b8.type = length_type_fixed;
    parse_length(element,5,&local_c0,true,false);
    parse_length(element,6,&local_b8,true,false);
    fVar23 = 0.0;
    if (local_c0.type == length_type_percent) {
      fVar23 = state->view_width;
    }
    fVar21 = local_c0.value;
    if (local_c0.type == length_type_percent) {
      fVar21 = (fVar23 * local_c0.value) / 100.0;
    }
    fVar23 = 0.0;
    if (local_b8.type == length_type_percent) {
      fVar23 = state->view_height;
    }
    fVar24 = local_b8.value;
    if (local_b8.type == length_type_percent) {
      fVar24 = (fVar23 * local_b8.value) / 100.0;
    }
    if (local_98.b == 2.8026e-45) {
      fVar23 = hypotf(state->view_width,state->view_height);
      local_d4 = (fVar22 * (fVar23 / 1.4142135)) / 100.0;
    }
    render_state_begin(element,&local_78,state);
    local_78.extents.x = fVar21 - local_d4;
    local_78.extents.y = fVar24 - local_d4;
    local_78.extents.w = local_d4 + local_d4;
    local_78.extents.h = local_78.extents.w;
    plutovg_path_reset(context->document->path);
    plutovg_path_add_circle(context->document->path,fVar21,fVar24,local_d4);
    goto LAB_00105f8a;
  default:
    goto switchD_00104f93_caseD_2;
  case 4:
    _Var6 = is_display_none(element);
    if (_Var6) {
      return;
    }
    _Var6 = is_visibility_hidden(element);
    if (_Var6) {
      return;
    }
    local_98.a = 0.0;
    local_98.b = 1.4013e-45;
    local_c0.value = 0.0;
    local_c0.type = length_type_fixed;
    parse_length(element,0x18,(length_t *)&local_98,false,false);
    parse_length(element,0x19,&local_c0,false,false);
    fVar22 = local_98.a;
    if ((local_98.a == 0.0) && (!NAN(local_98.a))) {
      return;
    }
    fVar23 = local_c0.value;
    if ((local_c0.value == 0.0) && (!NAN(local_c0.value))) {
      return;
    }
    local_d4 = local_c0.value;
    local_b8.value = 0.0;
    local_b8.type = length_type_fixed;
    local_b0.value = 0.0;
    local_b0.type = length_type_fixed;
    parse_length(element,5,&local_b8,true,false);
    parse_length(element,6,&local_b0,true,false);
    fVar21 = 0.0;
    if (local_b8.type == length_type_percent) {
      fVar21 = state->view_width;
    }
    if (local_b8.type == length_type_percent) {
      local_c8 = (fVar21 * local_b8.value) / 100.0;
    }
    else {
      local_c8 = local_b8.value;
    }
    fVar21 = 0.0;
    if (local_b0.type == length_type_percent) {
      fVar21 = state->view_height;
    }
    fVar24 = local_b0.value;
    if (local_b0.type == length_type_percent) {
      fVar24 = (fVar21 * local_b0.value) / 100.0;
    }
    if (local_98.b == 2.8026e-45) {
      fVar22 = (fVar22 * state->view_width) / 100.0;
    }
    if (local_c0.type == length_type_percent) {
      local_d4 = (fVar23 * state->view_height) / 100.0;
    }
    render_state_begin(element,&local_78,state);
    local_78.extents.x = local_c8 - fVar22;
    local_78.extents.y = fVar24 - local_d4;
    local_78.extents.w = fVar22 + fVar22;
    local_78.extents.h = local_d4 + local_d4;
    plutovg_path_reset(context->document->path);
    plutovg_path_add_ellipse(context->document->path,local_c8,fVar24,fVar22,local_d4);
    goto LAB_00105f8a;
  case 5:
    _Var6 = is_display_none(element);
    if (_Var6) {
      return;
    }
    render_state_begin(element,&local_78,state);
    peVar19 = element->first_child;
    if (peVar19 != (element *)0x0) {
      do {
        render_element(peVar19,context,&local_78);
        peVar19 = peVar19->next_sibling;
      } while (peVar19 != (element *)0x0);
    }
    break;
  case 6:
    _Var6 = is_display_none(element);
    if (_Var6) {
      return;
    }
    _Var6 = is_visibility_hidden(element);
    if (_Var6) {
      return;
    }
    local_b8.value = 0.0;
    local_b8.type = length_type_fixed;
    local_b0.value = 0.0;
    local_b0.type = length_type_fixed;
    parse_length(element,0x29,&local_b8,false,false);
    parse_length(element,0x10,&local_b0,false,false);
    fVar22 = local_b8.value;
    if ((local_b8.value == 0.0) && (!NAN(local_b8.value))) {
      return;
    }
    fVar23 = local_b0.value;
    if ((local_b0.value == 0.0) && (!NAN(local_b0.value))) {
      return;
    }
    local_d4 = local_b0.value;
    local_80.value = 0.0;
    local_80.type = length_type_fixed;
    local_a0.value = 0.0;
    local_a0.type = length_type_fixed;
    parse_length(element,0x2a,&local_80,true,false);
    parse_length(element,0x2d,&local_a0,true,false);
    fVar21 = 0.0;
    if (local_80.type == length_type_percent) {
      fVar21 = state->view_width;
    }
    local_c8 = local_80.value;
    if (local_80.type == length_type_percent) {
      local_c8 = (fVar21 * local_80.value) / 100.0;
    }
    fVar21 = 0.0;
    if (local_a0.type == length_type_percent) {
      fVar21 = state->view_height;
    }
    local_c4 = local_a0.value;
    if (local_a0.type == length_type_percent) {
      local_c4 = (fVar21 * local_a0.value) / 100.0;
    }
    if (local_b8.type == length_type_percent) {
      fVar22 = (fVar22 * state->view_width) / 100.0;
    }
    if (local_b0.type == length_type_percent) {
      local_d4 = (fVar23 * state->view_height) / 100.0;
    }
    render_state_begin(element,&local_78,state);
    local_78.extents.h = local_d4;
    local_78.extents.x = local_c8;
    local_78.extents.y = local_c4;
    local_78.extents.w = fVar22;
    if (local_78.mode != render_mode_bounding) {
      for (paVar10 = element->attributes; paVar10 != (attribute *)0x0; paVar10 = paVar10->next) {
        if (paVar10->id == 0x11) {
          psVar11 = &paVar10->value;
          goto LAB_00105fa8;
        }
      }
      psVar11 = (string_t *)0x0;
LAB_00105fa8:
      if (psVar11 == (string_t *)0x0) {
LAB_0010615f:
        surface = (plutovg_surface_t *)0x0;
      }
      else {
        pcVar15 = psVar11->data;
        sVar3 = psVar11->length;
        pcVar2 = pcVar15 + sVar3;
        if ((long)sVar3 < 1) {
          pcVar14 = pcVar15;
          pcVar16 = "data:image/png";
        }
        else {
          sVar17 = 0;
          do {
            pcVar14 = pcVar15 + 0xe;
            pcVar16 = "";
            if (sVar17 == 0xe) break;
            if (pcVar15[sVar17] != "data:image/png"[sVar17]) {
              pcVar14 = pcVar15 + sVar17;
              pcVar16 = "data:image/png" + sVar17;
              break;
            }
            sVar17 = sVar17 + 1;
            pcVar14 = pcVar2;
            pcVar16 = "data:image/png" + sVar3;
          } while (sVar3 != sVar17);
        }
        if (*pcVar16 != '\0') {
          if (pcVar15 < pcVar2) {
            lVar18 = 0;
            do {
              pcVar14 = pcVar15 + 0xe;
              pcVar16 = "";
              if (lVar18 == 0xe) break;
              if (pcVar15[lVar18] != "data:image/jpg"[lVar18]) {
                pcVar14 = pcVar15 + lVar18;
                pcVar16 = "data:image/jpg" + lVar18;
                break;
              }
              lVar5 = lVar18 + 1;
              lVar18 = lVar18 + 1;
              pcVar14 = pcVar2;
              pcVar16 = "data:image/jpg" + ((long)pcVar2 - (long)pcVar15);
            } while (pcVar15 + lVar5 != pcVar2);
          }
          else {
            pcVar14 = pcVar15;
            pcVar16 = "data:image/jpg";
          }
          if (*pcVar16 != '\0') {
            if (pcVar15 < pcVar2) {
              lVar18 = 0;
              do {
                pcVar14 = pcVar15 + 0xf;
                pcVar16 = "";
                if (lVar18 == 0xf) break;
                if (pcVar15[lVar18] != "data:image/jpeg"[lVar18]) {
                  pcVar14 = pcVar15 + lVar18;
                  pcVar16 = "data:image/jpeg" + lVar18;
                  break;
                }
                lVar5 = lVar18 + 1;
                lVar18 = lVar18 + 1;
                pcVar14 = pcVar2;
                pcVar16 = "data:image/jpeg" + ((long)pcVar2 - (long)pcVar15);
              } while (pcVar15 + lVar5 != pcVar2);
            }
            else {
              pcVar14 = pcVar15;
              pcVar16 = "data:image/jpeg";
            }
            if (*pcVar16 != '\0') goto LAB_0010615f;
          }
        }
        if (pcVar14 < pcVar2) {
          lVar18 = 0;
          do {
            pcVar15 = "";
            pcVar16 = pcVar14 + 8;
            if (lVar18 == 8) break;
            if (pcVar14[lVar18] != ";base64,"[lVar18]) {
              pcVar15 = ";base64," + lVar18;
              pcVar16 = pcVar14 + lVar18;
              break;
            }
            lVar5 = lVar18 + 1;
            lVar18 = lVar18 + 1;
            pcVar15 = ";base64," + ((long)pcVar2 - (long)pcVar14);
            pcVar16 = pcVar2;
          } while (pcVar14 + lVar5 != pcVar2);
        }
        else {
          pcVar15 = ";base64,";
          pcVar16 = pcVar14;
        }
        if (*pcVar15 != '\0') goto LAB_0010615f;
        surface = plutovg_surface_load_from_image_base64(pcVar16,(int)pcVar2 - (int)pcVar16);
      }
      if (surface != (plutovg_surface_t *)0x0) {
        iVar8 = plutovg_surface_get_width(surface);
        local_a4 = (float)iVar8;
        iVar8 = plutovg_surface_get_height(surface);
        local_a8 = (float)iVar8;
        local_c0.value = 7.00649e-45;
        local_c0.type = length_type_unknown;
        parse_view_position(element,(int)&local_c0,position);
        fVar23 = 0.0;
        local_98.d = local_a8;
        local_98.a = local_a4;
        if (local_c0.value == 0.0) {
          fVar21 = 0.0;
        }
        else if (local_c0.type == length_type_fixed) {
          fVar21 = 0.0;
          fVar23 = 0.0;
          if (local_d4 < fVar22 * (local_a8 / local_a4)) {
            local_98.d = (local_a4 / fVar22) * local_d4;
            if ((int)local_c0.value - 7U < 3) {
              fVar23 = local_a8 - local_98.d;
            }
            else if ((int)local_c0.value - 4U < 3) {
              fVar23 = (local_a8 - local_98.d) * 0.5 + 0.0;
            }
          }
          if ((fVar22 < local_d4 / (local_a8 / local_a4)) &&
             (local_98.a = (local_a8 / local_d4) * fVar22, (uint)local_c0.value < 10)) {
            if ((0x124U >> ((uint)local_c0.value & 0x1f) & 1) == 0) {
              if ((0x248U >> ((uint)local_c0.value & 0x1f) & 1) != 0) {
                fVar21 = local_a4 - local_98.a;
              }
            }
            else {
              fVar21 = (local_a4 - local_98.a) * 0.5 + 0.0;
            }
          }
        }
        else {
          fVar21 = fVar22;
          if (local_c0.type == length_type_unknown) {
            fVar25 = fVar22 * (local_a8 / local_a4);
            fVar24 = local_d4;
            if (fVar25 < local_d4) {
              fVar24 = fVar25;
              if ((int)local_c0.value - 7U < 3) {
                local_c4 = local_c4 + (local_d4 - fVar25);
              }
              else if ((int)local_c0.value - 4U < 3) {
                local_c4 = local_c4 + (local_d4 - fVar25) * 0.5;
              }
            }
            fVar25 = local_d4 / (local_a8 / local_a4);
            local_d4 = fVar24;
            if ((fVar25 < fVar22) && (fVar21 = fVar25, (uint)local_c0.value < 10)) {
              if ((0x124U >> ((uint)local_c0.value & 0x1f) & 1) == 0) {
                if ((0x248U >> ((uint)local_c0.value & 0x1f) & 1) == 0) goto LAB_0010635f;
                fVar22 = fVar22 - fVar25;
              }
              else {
                fVar22 = (fVar22 - fVar25) * 0.5;
              }
              local_c8 = local_c8 + fVar22;
            }
          }
LAB_0010635f:
          fVar22 = fVar21;
          fVar21 = 0.0;
        }
        local_98.a = fVar22 / local_98.a;
        local_98.d = local_d4 / local_98.d;
        local_98.b = 0.0;
        local_98.c = 0.0;
        local_98.e = -fVar21 * local_98.a;
        local_98.f = -fVar23 * local_98.d;
        plutovg_canvas_set_fill_rule(context->canvas,PLUTOVG_FILL_RULE_NON_ZERO);
        plutovg_canvas_set_opacity(context->canvas,local_78.opacity);
        plutovg_canvas_set_matrix(context->canvas,&local_78.matrix);
        plutovg_canvas_translate(context->canvas,local_c8,local_c4);
        plutovg_canvas_set_texture(context->canvas,surface,PLUTOVG_TEXTURE_TYPE_PLAIN,1.0,&local_98)
        ;
        plutovg_canvas_fill_rect(context->canvas,0.0,0.0,fVar22,local_d4);
        plutovg_surface_destroy(surface);
      }
    }
    break;
  case 7:
    _Var6 = is_display_none(element);
    if (_Var6) {
      return;
    }
    _Var6 = is_visibility_hidden(element);
    if (_Var6) {
      return;
    }
    local_98.a = 0.0;
    local_98.b = 1.4013e-45;
    local_c0.value = 0.0;
    local_c0.type = length_type_fixed;
    local_b8.value = 0.0;
    local_b8.type = length_type_fixed;
    local_b0.value = 0.0;
    local_b0.type = length_type_fixed;
    parse_length(element,0x2b,(length_t *)&local_98,true,false);
    parse_length(element,0x2e,&local_c0,true,false);
    parse_length(element,0x2c,&local_b8,true,false);
    parse_length(element,0x2f,&local_b0,true,false);
    fVar22 = local_98.a;
    if (local_98.b == 2.8026e-45) {
      fVar22 = (state->view_width * local_98.a) / 100.0;
    }
    fVar23 = 0.0;
    if (local_c0.type == length_type_percent) {
      fVar23 = state->view_height;
    }
    fVar21 = local_c0.value;
    if (local_c0.type == length_type_percent) {
      fVar21 = (fVar23 * local_c0.value) / 100.0;
    }
    fVar23 = 0.0;
    if (local_b8.type == length_type_percent) {
      fVar23 = state->view_width;
    }
    fVar24 = local_b8.value;
    if (local_b8.type == length_type_percent) {
      fVar24 = (fVar23 * local_b8.value) / 100.0;
    }
    fVar23 = 0.0;
    if (local_b0.type == length_type_percent) {
      fVar23 = state->view_height;
    }
    if (local_b0.type == length_type_percent) {
      local_d4 = (fVar23 * local_b0.value) / 100.0;
    }
    else {
      local_d4 = local_b0.value;
    }
    render_state_begin(element,&local_78,state);
    local_78.extents.x = fVar22;
    if (fVar24 <= fVar22) {
      local_78.extents.x = fVar24;
    }
    local_78.extents.y = fVar21;
    if (local_d4 <= fVar21) {
      local_78.extents.y = local_d4;
    }
    local_78.extents.w = ABS(fVar24 - fVar22);
    local_78.extents.h = ABS(local_d4 - fVar21);
    plutovg_path_reset(context->document->path);
    plutovg_path_move_to(context->document->path,fVar22,fVar21);
    plutovg_path_line_to(context->document->path,fVar24,local_d4);
    goto LAB_00105f8a;
  case 9:
    _Var6 = is_display_none(element);
    if (_Var6) {
      return;
    }
    _Var6 = is_visibility_hidden(element);
    if (_Var6) {
      return;
    }
    render_state_begin(element,&local_78,state);
    plutovg_path_reset(context->document->path);
    for (paVar10 = element->attributes; paVar10 != (attribute *)0x0; paVar10 = paVar10->next) {
      if (paVar10->id == 7) {
        psVar11 = &paVar10->value;
        goto LAB_00105abe;
      }
    }
    psVar11 = (string_t *)0x0;
LAB_00105abe:
    if (psVar11 != (string_t *)0x0) {
      plutovg_path_parse(context->document->path,psVar11->data,(int)psVar11->length);
    }
    goto LAB_00105ad5;
  case 10:
  case 0xb:
    _Var6 = is_display_none(element);
    if (_Var6) {
      return;
    }
    _Var6 = is_visibility_hidden(element);
    if (_Var6) {
      return;
    }
    render_state_begin(element,&local_78,state);
    plutovg_path_reset(context->document->path);
    for (paVar10 = element->attributes; paVar10 != (attribute *)0x0; paVar10 = paVar10->next) {
      if (paVar10->id == 0x15) {
        psVar11 = &paVar10->value;
        goto LAB_0010580d;
      }
    }
    psVar11 = (string_t *)0x0;
LAB_0010580d:
    if (psVar11 != (string_t *)0x0) {
      path = context->document->path;
      pcVar2 = psVar11->data;
      local_98.a = SUB84(pcVar2,0);
      local_98.b = (float)((ulong)pcVar2 >> 0x20);
      end = (byte *)(pcVar2 + psVar11->length);
      bVar7 = true;
      do {
        if (end <= (byte *)CONCAT44(local_98.b,local_98.a)) {
          if (element->id == 10) {
            plutovg_path_close(path);
          }
          break;
        }
        _Var6 = parse_float((char **)&local_98,(char *)end,&local_c0.value);
        if (_Var6) {
          pbVar12 = (byte *)CONCAT44(local_98.b,local_98.a);
          bVar20 = pbVar12 < end;
          pbVar13 = pbVar12;
          if (bVar20) {
            bVar20 = false;
            if (((ulong)*pbVar12 < 0x2d) && ((0x100100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0)
               ) {
              bVar20 = true;
              do {
                pbVar13 = pbVar12;
                if ((0x20 < (ulong)*pbVar12) ||
                   ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0)) break;
                pbVar12 = pbVar12 + 1;
                bVar20 = pbVar12 < end;
                pbVar13 = end;
              } while (pbVar12 != end);
              goto LAB_001058b7;
            }
          }
          else {
LAB_001058b7:
            pbVar12 = pbVar13;
            if (bVar20) {
              bVar20 = false;
              if (pbVar13 < end) {
                bVar20 = *pbVar13 == 0x2c;
                pbVar13 = pbVar13 + bVar20;
              }
              pbVar12 = pbVar13;
              if ((bVar20) && (pbVar13 < end)) {
                while (pbVar12 = pbVar13, (ulong)*pbVar13 < 0x21) {
                  if (((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0) ||
                     (pbVar13 = pbVar13 + 1, pbVar12 = end, pbVar13 == end)) break;
                }
              }
            }
            local_98.a = SUB84(pbVar12,0);
            local_98.b = (float)((ulong)pbVar12 >> 0x20);
            if ((end <= pbVar12) ||
               (_Var6 = parse_float((char **)&local_98,(char *)end,&local_b8.value), !_Var6))
            goto LAB_001059b6;
            pbVar12 = (byte *)CONCAT44(local_98.b,local_98.a);
            bVar20 = pbVar12 < end;
            pbVar13 = pbVar12;
            if (bVar20) {
              if (((ulong)*pbVar12 < 0x2d) &&
                 ((0x100100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0)) {
                bVar20 = true;
                do {
                  pbVar13 = pbVar12;
                  if ((0x20 < (ulong)*pbVar12) ||
                     ((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0)) break;
                  pbVar12 = pbVar12 + 1;
                  bVar20 = pbVar12 < end;
                  pbVar13 = end;
                } while (pbVar12 != end);
                goto LAB_0010595a;
              }
            }
            else {
LAB_0010595a:
              pbVar12 = pbVar13;
              if (bVar20) {
                bVar20 = false;
                if (pbVar13 < end) {
                  bVar20 = *pbVar13 == 0x2c;
                  pbVar13 = pbVar13 + bVar20;
                }
                pbVar12 = pbVar13;
                if ((bVar20) && (pbVar13 < end)) {
                  while (pbVar12 = pbVar13, (ulong)*pbVar13 < 0x21) {
                    if (((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0) ||
                       (pbVar13 = pbVar13 + 1, pbVar12 = end, pbVar13 == end)) break;
                  }
                }
              }
              local_98.a = SUB84(pbVar12,0);
              local_98.b = (float)((ulong)pbVar12 >> 0x20);
            }
            if (bVar7) {
              plutovg_path_move_to(path,local_c0.value,local_b8.value);
            }
            else {
              plutovg_path_line_to(path,local_c0.value,local_b8.value);
            }
            bVar20 = true;
            bVar7 = false;
          }
        }
        else {
LAB_001059b6:
          bVar20 = false;
        }
      } while (bVar20);
    }
LAB_00105ad5:
    plutovg_path_extents(context->document->path,&local_78.extents,false);
    draw_shape(element,context,&local_78);
    break;
  case 0xd:
    _Var6 = is_display_none(element);
    if (_Var6) {
      return;
    }
    _Var6 = is_visibility_hidden(element);
    if (_Var6) {
      return;
    }
    local_98.a = 0.0;
    local_98.b = 1.4013e-45;
    local_c0.value = 0.0;
    local_c0.type = length_type_fixed;
    parse_length(element,0x29,(length_t *)&local_98,false,false);
    parse_length(element,0x10,&local_c0,false,false);
    fVar22 = local_98.a;
    if ((local_98.a == 0.0) && (!NAN(local_98.a))) {
      return;
    }
    fVar23 = local_c0.value;
    if ((local_c0.value == 0.0) && (!NAN(local_c0.value))) {
      return;
    }
    local_b8.value = 0.0;
    local_b8.type = length_type_fixed;
    local_b0.value = 0.0;
    local_b0.type = length_type_fixed;
    parse_length(element,0x2a,&local_b8,true,false);
    parse_length(element,0x2d,&local_b0,true,false);
    fVar21 = 0.0;
    if (local_b8.type == length_type_percent) {
      fVar21 = state->view_width;
    }
    if (local_b8.type == length_type_percent) {
      local_c8 = (fVar21 * local_b8.value) / 100.0;
    }
    else {
      local_c8 = local_b8.value;
    }
    fVar21 = 0.0;
    if (local_b0.type == length_type_percent) {
      fVar21 = state->view_height;
    }
    fVar24 = local_b0.value;
    if (local_b0.type == length_type_percent) {
      fVar24 = (fVar21 * local_b0.value) / 100.0;
    }
    if (local_98.b == 2.8026e-45) {
      fVar22 = (fVar22 * state->view_width) / 100.0;
    }
    if (local_c0.type == length_type_percent) {
      fVar23 = (fVar23 * state->view_height) / 100.0;
    }
    local_80.value = 0.0;
    local_80.type = length_type_unknown;
    local_a0.value = 0.0;
    local_a0.type = length_type_unknown;
    parse_length(element,0x18,&local_80,false,false);
    parse_length(element,0x19,&local_a0,false,false);
    fVar21 = 0.0;
    if (local_80.type == length_type_percent) {
      fVar21 = state->view_width;
    }
    fVar25 = local_80.value;
    if (local_80.type == length_type_percent) {
      fVar25 = (fVar21 * local_80.value) / 100.0;
    }
    fVar21 = 0.0;
    if (local_a0.type == length_type_percent) {
      fVar21 = state->view_height;
    }
    fVar26 = local_a0.value;
    if (local_a0.type == length_type_percent) {
      fVar26 = (fVar21 * local_a0.value) / 100.0;
    }
    local_a4 = fVar26;
    if (local_80.type != length_type_unknown) {
      local_a4 = fVar25;
    }
    local_a8 = local_a4;
    if (local_a0.type != length_type_unknown) {
      local_a8 = fVar26;
    }
    render_state_begin(element,&local_78,state);
    local_78.extents.x = local_c8;
    local_78.extents.y = fVar24;
    local_78.extents.w = fVar22;
    local_78.extents.h = fVar23;
    plutovg_path_reset(context->document->path);
    plutovg_path_add_round_rect
              (context->document->path,local_c8,fVar24,fVar22,fVar23,local_a4,local_a8);
LAB_00105f8a:
    draw_shape(element,context,&local_78);
    break;
  case 0xf:
    render_svg(element,context,state);
    return;
  case 0x11:
    _Var6 = is_display_none(element);
    prVar9 = state;
    if (_Var6) {
      return;
    }
    do {
      ppeVar1 = &prVar9->element;
      if (*ppeVar1 == element) {
        return;
      }
      pprVar4 = &prVar9->parent;
      prVar9 = *pprVar4;
    } while (*pprVar4 != (render_state *)0x0);
    if (*ppeVar1 == element) {
      return;
    }
    element_00 = resolve_href(context->document,element);
    if (element_00 == (element_t *)0x0) {
      return;
    }
    local_98.a = 0.0;
    local_98.b = 1.4013e-45;
    local_c0.value = 0.0;
    local_c0.type = length_type_fixed;
    parse_length(element,0x2a,(length_t *)&local_98,true,false);
    parse_length(element,0x2d,&local_c0,true,false);
    fVar22 = local_98.a;
    if (local_98.b == 2.8026e-45) {
      fVar22 = (state->view_width * local_98.a) / 100.0;
    }
    fVar23 = 0.0;
    if (local_c0.type == length_type_percent) {
      fVar23 = state->view_height;
    }
    fVar21 = local_c0.value;
    if (local_c0.type == length_type_percent) {
      fVar21 = (fVar23 * local_c0.value) / 100.0;
    }
    render_state_begin(element,&local_78,state);
    plutovg_matrix_translate(&local_78.matrix,fVar22,fVar21);
    peVar19 = element_00->parent;
    element_00->parent = element;
    if (element_00->id - 0xfU < 2) {
      render_svg(element_00,context,&local_78);
    }
    else {
      render_element(element_00,context,&local_78);
    }
    element_00->parent = peVar19;
  }
  render_state_end(&local_78);
switchD_00104f93_caseD_2:
  return;
}

Assistant:

static void render_element(const element_t* element, const render_context_t* context, render_state_t* state)
{
    switch(element->id) {
    case TAG_SVG:
        render_svg(element, context, state);
        break;
    case TAG_USE:
        render_use(element, context, state);
        break;
    case TAG_G:
        render_g(element, context, state);
        break;
    case TAG_LINE:
        render_line(element, context, state);
        break;
    case TAG_ELLIPSE:
        render_ellipse(element, context, state);
        break;
    case TAG_CIRCLE:
        render_circle(element, context, state);
        break;
    case TAG_RECT:
        render_rect(element, context, state);
        break;
    case TAG_POLYLINE:
    case TAG_POLYGON:
        render_poly(element, context, state);
        break;
    case TAG_PATH:
        render_path(element, context, state);
        break;
    case TAG_IMAGE:
        render_image(element, context, state);
        break;
    }
}